

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::FormatDeathTestOutput(string *output)

{
  ulong in_RSI;
  string *in_RDI;
  size_t line_end;
  size_t at;
  string *ret;
  string local_78 [32];
  string local_58 [48];
  long local_28;
  long local_20;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = 0;
  while( true ) {
    local_28 = std::__cxx11::string::find((char)local_10,10);
    std::__cxx11::string::operator+=((string *)in_RDI,"[  DEATH   ] ");
    if (local_28 == -1) break;
    std::__cxx11::string::substr((ulong)local_78,local_10);
    std::__cxx11::string::operator+=((string *)in_RDI,local_78);
    std::__cxx11::string::~string(local_78);
    local_20 = local_28 + 1;
  }
  std::__cxx11::string::substr((ulong)local_58,local_10);
  std::__cxx11::string::operator+=((string *)in_RDI,local_58);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
  ::std::string ret;
  for (size_t at = 0; ; ) {
    const size_t line_end = output.find('\n', at);
    ret += "[  DEATH   ] ";
    if (line_end == ::std::string::npos) {
      ret += output.substr(at);
      break;
    }
    ret += output.substr(at, line_end + 1 - at);
    at = line_end + 1;
  }
  return ret;
}